

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexHashMap.h
# Opt level: O0

void __thiscall
Ptex::v2_2::PtexHashMap<Ptex::v2_2::StringKey,_Ptex::v2_2::PtexCachedReader_*>::initContents
          (PtexHashMap<Ptex::v2_2::StringKey,_Ptex::v2_2::PtexCachedReader_*> *this)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  ulong *puVar4;
  undefined8 *in_RDI;
  ulong uVar5;
  Entry *in_stack_ffffffffffffffa0;
  ulong *local_48;
  
  *(undefined4 *)(in_RDI + 1) = 0x10;
  *(undefined4 *)((long)in_RDI + 0xc) = 0;
  uVar2 = CONCAT44(0,*(uint *)(in_RDI + 1));
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar2;
  uVar3 = SUB168(auVar1 * ZEXT816(0x20),0);
  uVar5 = uVar3 + 8;
  if (SUB168(auVar1 * ZEXT816(0x20),8) != 0 || 0xfffffffffffffff7 < uVar3) {
    uVar5 = 0xffffffffffffffff;
  }
  puVar4 = (ulong *)operator_new__(uVar5);
  *puVar4 = uVar2;
  puVar4 = puVar4 + 1;
  if (uVar2 != 0) {
    local_48 = puVar4;
    do {
      Entry::Entry(in_stack_ffffffffffffffa0);
      local_48 = local_48 + 4;
    } while (local_48 != puVar4 + uVar2 * 4);
  }
  *in_RDI = puVar4;
  return;
}

Assistant:

void initContents()
    {
        _numEntries = 16;
        _size = 0;
        _entries = new Entry[_numEntries];
    }